

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::GetTypedArrayInfoAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  JsRTVarsArgumentAction_InternalUse<1UL> *argAction;
  TTDVar origVar;
  Var aValue;
  TypedArrayBase *this;
  AutoNestedHandledExceptionType local_3c;
  ArrayBufferBase *pAStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  Var res;
  TypedArrayBase *typedArrayBase;
  Var var;
  JsRTSingleVarArgumentAction *action;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)61>
                        (evt);
  origVar = GetVarItem_0<1ul>(argAction);
  aValue = InflateVarInReplay(executeContext,origVar);
  this = Js::VarTo<Js::TypedArrayBase>(aValue);
  pAStack_38 = Js::ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_3c,ExceptionType_OutOfMemory);
  JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)61>
            (executeContext,evt,pAStack_38);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
  return;
}

Assistant:

void GetTypedArrayInfoAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::GetTypedArrayInfoActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));

            Js::TypedArrayBase* typedArrayBase = Js::VarTo<Js::TypedArrayBase>(var);
            Js::Var res = typedArrayBase->GetArrayBuffer();

            //Need additional notify since JsRTActionHandleResultForReplay may allocate but GetTypedArrayInfo does not enter runtime
            //Failure will kick all the way out to replay loop -- which is what we want
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);
            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::GetTypedArrayInfoActionTag>(executeContext, evt, res);
        }